

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O0

void __thiscall
amrex::EBCellFlagFab::EBCellFlagFab
          (EBCellFlagFab *this,EBCellFlagFab *rhs,MakeType make_type,int scomp,int ncomp)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  BaseFab<amrex::EBCellFlag> *unaff_retaddr;
  undefined4 in_stack_00000008;
  
  BaseFab<amrex::EBCellFlag>::BaseFab
            ((BaseFab<amrex::EBCellFlag> *)CONCAT44(ncomp,in_stack_00000008),unaff_retaddr,
             (MakeType)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
  *in_RDI = &PTR__EBCellFlagFab_01801e90;
  *(undefined4 *)((long)in_RDI + 0x44) = 100;
  std::
  map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
  ::map((map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
         *)0x1176c4d);
  return;
}

Assistant:

EBCellFlagFab::EBCellFlagFab (const EBCellFlagFab& rhs,
                              MakeType make_type, int scomp, int ncomp)
    : BaseFab<EBCellFlag>(rhs,make_type,scomp,ncomp)
{}